

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amrex_parser.tab.cpp
# Opt level: O1

int amrex_parserparse(void)

{
  size_t __n;
  short sVar1;
  int iVar2;
  char *__dest;
  parser_node *ppVar3;
  parser_node *ppVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  parser_node_t type;
  parser_f2_t ftype;
  long lVar11;
  char *__src;
  double *__dest_00;
  double *pdVar12;
  char cVar13;
  yy_state_t yyssa [200];
  AMREX_PARSERSTYPE yyvsa [200];
  double *local_768;
  char local_748 [208];
  double local_678 [201];
  
  amrex_parserchar = -2;
  uVar10 = 0;
  lVar11 = 200;
  pcVar7 = local_748;
  pdVar12 = local_678;
  __src = pcVar7;
  local_768 = pdVar12;
  while( true ) {
    *pcVar7 = (char)uVar10;
    if (__src + lVar11 + -1 <= pcVar7) {
      cVar13 = '\x04';
      pcVar5 = __src;
      if (lVar11 < 10000) {
        lVar6 = (long)pcVar7 - (long)__src;
        __n = lVar6 + 1;
        lVar11 = lVar11 * 2;
        if (9999 < lVar11) {
          lVar11 = 10000;
        }
        __dest = (char *)malloc(lVar11 * 9 + 7);
        if (__dest == (char *)0x0) {
          cVar13 = '\x04';
        }
        else {
          memcpy(__dest,__src,__n);
          uVar8 = lVar11 + 0xe;
          if (-1 < (long)(lVar11 + 7U)) {
            uVar8 = lVar11 + 7U;
          }
          __dest_00 = (double *)(__dest + (uVar8 & 0xfffffffffffffff8));
          memcpy(__dest_00,local_768,__n * 8);
          cVar13 = '\0';
          pcVar5 = __dest;
          local_768 = __dest_00;
          if (__src != local_748) {
            free(__src);
          }
        }
        if (__dest != (char *)0x0) {
          pcVar7 = pcVar5 + lVar6;
          pdVar12 = local_768 + lVar6;
          cVar13 = (lVar11 <= (long)__n) * '\t';
        }
      }
      __src = pcVar5;
      if (cVar13 != '\0') {
        iVar2 = 1;
        if (cVar13 == '\x04') {
          amrex_parsererror("memory exhausted");
          iVar2 = 2;
        }
        goto LAB_0066dac9;
      }
    }
    pcVar5 = __src;
    if ((int)uVar10 == 2) {
      iVar2 = 0;
      goto LAB_0066dac9;
    }
    uVar8 = (ulong)(int)uVar10;
    if ((0x242000400008000dU >> (uVar10 & 0x3f) & 1) == 0) break;
LAB_0066d81a:
    if ((0x1bc0003bf7f4ffe2U >> (uVar8 & 0x3f) & 1) != 0) {
      amrex_parsernerrs = amrex_parsernerrs + 1;
      amrex_parsererror("syntax error");
      goto LAB_0066dac4;
    }
    iVar2 = (int)"\x02"[uVar8];
LAB_0066d842:
    lVar6 = (long)""[iVar2];
    ppVar3 = (parser_node *)pdVar12[1 - lVar6];
    switch(iVar2) {
    case 3:
      amrex::parser_defexpr((parser_node *)pdVar12[-1]);
      break;
    case 4:
      ppVar3 = amrex::parser_newnumber(*pdVar12);
      break;
    case 5:
      ppVar3 = amrex::parser_newsymbol((parser_symbol *)*pdVar12);
      break;
    case 6:
      ppVar3 = (parser_node *)pdVar12[-2];
      ppVar4 = (parser_node *)*pdVar12;
      type = PARSER_ADD;
      goto LAB_0066d9a1;
    case 7:
      ppVar3 = (parser_node *)pdVar12[-2];
      ppVar4 = (parser_node *)*pdVar12;
      type = PARSER_SUB;
      goto LAB_0066d9a1;
    case 8:
      ppVar3 = (parser_node *)pdVar12[-2];
      ppVar4 = (parser_node *)*pdVar12;
      type = PARSER_MUL;
      goto LAB_0066d9a1;
    case 9:
      ppVar3 = (parser_node *)pdVar12[-2];
      ppVar4 = (parser_node *)*pdVar12;
      type = PARSER_DIV;
      goto LAB_0066d9a1;
    case 10:
      ppVar3 = (parser_node *)pdVar12[-1];
      break;
    case 0xb:
      ppVar3 = (parser_node *)pdVar12[-2];
      ppVar4 = (parser_node *)*pdVar12;
      ftype = PARSER_LT;
      goto LAB_0066d9d0;
    case 0xc:
      ppVar3 = (parser_node *)pdVar12[-2];
      ppVar4 = (parser_node *)*pdVar12;
      ftype = PARSER_GT;
      goto LAB_0066d9d0;
    case 0xd:
      ppVar3 = (parser_node *)pdVar12[-2];
      ppVar4 = (parser_node *)*pdVar12;
      ftype = PARSER_LEQ;
      goto LAB_0066d9d0;
    case 0xe:
      ppVar3 = (parser_node *)pdVar12[-2];
      ppVar4 = (parser_node *)*pdVar12;
      ftype = PARSER_GEQ;
      goto LAB_0066d9d0;
    case 0xf:
      ppVar3 = (parser_node *)pdVar12[-2];
      ppVar4 = (parser_node *)*pdVar12;
      ftype = PARSER_EQ;
      goto LAB_0066d9d0;
    case 0x10:
      ppVar3 = (parser_node *)pdVar12[-2];
      ppVar4 = (parser_node *)*pdVar12;
      ftype = PARSER_NEQ;
      goto LAB_0066d9d0;
    case 0x11:
      ppVar3 = (parser_node *)pdVar12[-2];
      ppVar4 = (parser_node *)*pdVar12;
      ftype = PARSER_AND;
      goto LAB_0066d9d0;
    case 0x12:
      ppVar3 = (parser_node *)pdVar12[-2];
      ppVar4 = (parser_node *)*pdVar12;
      ftype = PARSER_OR;
      goto LAB_0066d9d0;
    case 0x13:
      ppVar3 = (parser_node *)*pdVar12;
      type = PARSER_NEG;
      ppVar4 = (parser_node *)0x0;
LAB_0066d9a1:
      ppVar3 = amrex::parser_newnode(type,ppVar3,ppVar4);
      break;
    case 0x14:
      ppVar3 = (parser_node *)*pdVar12;
      break;
    case 0x15:
      ppVar3 = (parser_node *)pdVar12[-2];
      ppVar4 = (parser_node *)*pdVar12;
      ftype = PARSER_POW;
      goto LAB_0066d9d0;
    case 0x16:
      ppVar3 = amrex::parser_newf1(*(parser_f1_t *)(pdVar12 + -3),(parser_node *)pdVar12[-1]);
      break;
    case 0x17:
      ftype = *(parser_f2_t *)(pdVar12 + -5);
      ppVar3 = (parser_node *)pdVar12[-3];
      ppVar4 = (parser_node *)pdVar12[-1];
LAB_0066d9d0:
      ppVar3 = amrex::parser_newf2(ftype,ppVar3,ppVar4);
      break;
    case 0x18:
      ppVar3 = amrex::parser_newf3(*(parser_f3_t *)(pdVar12 + -7),(parser_node *)pdVar12[-5],
                                   (parser_node *)pdVar12[-3],(parser_node *)pdVar12[-1]);
      break;
    case 0x19:
      ppVar3 = amrex::parser_newassign((parser_symbol *)pdVar12[-2],(parser_node *)*pdVar12);
      break;
    case 0x1a:
      ppVar3 = (parser_node *)pdVar12[-2];
      ppVar4 = (parser_node *)*pdVar12;
      goto LAB_0066da76;
    case 0x1b:
      ppVar3 = (parser_node *)pdVar12[-1];
      ppVar4 = (parser_node *)0x0;
LAB_0066da76:
      ppVar3 = amrex::parser_newlist(ppVar3,ppVar4);
    }
    pdVar12 = pdVar12 + -lVar6;
    pcVar7 = pcVar7 + -lVar6;
    pdVar12[1] = (double)ppVar3;
    uVar9 = (int)(char)(&DAT_006bcb1d)[""[iVar2]] + (int)*pcVar7;
    if (((int)uVar9 < 0) ||
       ("\b\t\n\x13\f\r\x0e\x0f\x1c\x1c\x1c\n\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !"
        [uVar9] != *pcVar7)) {
      pcVar5 = "" + ""[iVar2];
    }
    else {
      pcVar5 = "\x10\x11\x12\f\"#$%\r\x0e\x0f\x14\'()*+,-./01234\x02" + uVar9;
    }
    uVar9 = (uint)*pcVar5;
LAB_0066da44:
    uVar10 = (ulong)uVar9;
    pdVar12 = pdVar12 + 1;
    pcVar7 = pcVar7 + 1;
  }
  sVar1 = yypact[uVar8];
  if (amrex_parserchar == -2) {
    amrex_parserchar = amrex_parserlex();
  }
  if ((long)amrex_parserchar < 1) {
    amrex_parserchar = 0;
    iVar2 = 0;
  }
  else {
    if (amrex_parserchar == 0x100) {
      amrex_parserchar = 0x101;
LAB_0066dac4:
      iVar2 = 1;
LAB_0066dac9:
      if (pcVar5 != local_748) {
        free(pcVar5);
      }
      return iVar2;
    }
    iVar2 = 2;
    if (amrex_parserchar < 0x112) {
      iVar2 = (int)""[amrex_parserchar];
    }
  }
  uVar9 = sVar1 + iVar2;
  if ((0x112 < uVar9) ||
     (iVar2 != "\b\t\n\x13\f\r\x0e\x0f\x1c\x1c\x1c\n\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !"
               [uVar9])) goto LAB_0066d81a;
  uVar9 = (uint)"\x10\x11\x12\f\"#$%\r\x0e\x0f\x14\'()*+,-./01234\x02"[uVar9];
  if ((int)uVar9 < 1) {
    iVar2 = -uVar9;
    goto LAB_0066d842;
  }
  *(AMREX_PARSERSTYPE *)(pdVar12 + 1) = amrex_parserlval;
  amrex_parserchar = -2;
  goto LAB_0066da44;
}

Assistant:

int
yyparse (void)
{
    yy_state_fast_t yystate = 0;
    /* Number of tokens to shift before error messages enabled.  */
    int yyerrstatus = 0;

    /* Refer to the stacks through separate pointers, to allow yyoverflow
       to reallocate them elsewhere.  */

    /* Their size.  */
    YYPTRDIFF_T yystacksize = YYINITDEPTH;

    /* The state stack: array, bottom, top.  */
    yy_state_t yyssa[YYINITDEPTH];
    yy_state_t *yyss = yyssa;
    yy_state_t *yyssp = yyss;

    /* The semantic value stack: array, bottom, top.  */
    YYSTYPE yyvsa[YYINITDEPTH];
    YYSTYPE *yyvs = yyvsa;
    YYSTYPE *yyvsp = yyvs;

  int yyn;
  /* The return value of yyparse.  */
  int yyresult;
  /* Lookahead symbol kind.  */
  yysymbol_kind_t yytoken = YYSYMBOL_YYEMPTY;
  /* The variables used to return semantic value and location from the
     action routines.  */
  YYSTYPE yyval;



#define YYPOPSTACK(N)   (yyvsp -= (N), yyssp -= (N))

  /* The number of symbols on the RHS of the reduced rule.
     Keep to zero when no symbol should be popped.  */
  int yylen = 0;

  YYDPRINTF ((stderr, "Starting parse\n"));

  yychar = AMREX_PARSEREMPTY; /* Cause a token to be read.  */
  goto yysetstate;


/*------------------------------------------------------------.
| yynewstate -- push a new state, which is found in yystate.  |
`------------------------------------------------------------*/
yynewstate:
  /* In all cases, when you get here, the value and location stacks
     have just been pushed.  So pushing a state here evens the stacks.  */
  yyssp++;


/*--------------------------------------------------------------------.
| yysetstate -- set current state (the top of the stack) to yystate.  |
`--------------------------------------------------------------------*/
yysetstate:
  YYDPRINTF ((stderr, "Entering state %d\n", yystate));
  YY_ASSERT (0 <= yystate && yystate < YYNSTATES);
  YY_IGNORE_USELESS_CAST_BEGIN
  *yyssp = YY_CAST (yy_state_t, yystate);
  YY_IGNORE_USELESS_CAST_END
  YY_STACK_PRINT (yyss, yyssp);

  if (yyss + yystacksize - 1 <= yyssp)
#if !defined yyoverflow && !defined YYSTACK_RELOCATE
    goto yyexhaustedlab;
#else
    {
      /* Get the current used size of the three stacks, in elements.  */
      YYPTRDIFF_T yysize = yyssp - yyss + 1;

# if defined yyoverflow
      {
        /* Give user a chance to reallocate the stack.  Use copies of
           these so that the &'s don't force the real ones into
           memory.  */
        yy_state_t *yyss1 = yyss;
        YYSTYPE *yyvs1 = yyvs;

        /* Each stack pointer address is followed by the size of the
           data in use in that stack, in bytes.  This used to be a
           conditional around just the two extra args, but that might
           be undefined if yyoverflow is a macro.  */
        yyoverflow (YY_("memory exhausted"),
                    &yyss1, yysize * YYSIZEOF (*yyssp),
                    &yyvs1, yysize * YYSIZEOF (*yyvsp),
                    &yystacksize);
        yyss = yyss1;
        yyvs = yyvs1;
      }
# else /* defined YYSTACK_RELOCATE */
      /* Extend the stack our own way.  */
      if (YYMAXDEPTH <= yystacksize)
        goto yyexhaustedlab;
      yystacksize *= 2;
      if (YYMAXDEPTH < yystacksize)
        yystacksize = YYMAXDEPTH;

      {
        yy_state_t *yyss1 = yyss;
        union yyalloc *yyptr =
          YY_CAST (union yyalloc *,
                   YYSTACK_ALLOC (YY_CAST (YYSIZE_T, YYSTACK_BYTES (yystacksize))));
        if (! yyptr)
          goto yyexhaustedlab;
        YYSTACK_RELOCATE (yyss_alloc, yyss);
        YYSTACK_RELOCATE (yyvs_alloc, yyvs);
#  undef YYSTACK_RELOCATE
        if (yyss1 != yyssa)
          YYSTACK_FREE (yyss1);
      }
# endif

      yyssp = yyss + yysize - 1;
      yyvsp = yyvs + yysize - 1;

      YY_IGNORE_USELESS_CAST_BEGIN
      YYDPRINTF ((stderr, "Stack size increased to %ld\n",
                  YY_CAST (long, yystacksize)));
      YY_IGNORE_USELESS_CAST_END

      if (yyss + yystacksize - 1 <= yyssp)
        YYABORT;
    }
#endif /* !defined yyoverflow && !defined YYSTACK_RELOCATE */

  if (yystate == YYFINAL)
    YYACCEPT;

  goto yybackup;


/*-----------.
| yybackup.  |
`-----------*/
yybackup:
  /* Do appropriate processing given the current state.  Read a
     lookahead token if we need one and don't already have one.  */

  /* First try to decide what to do without reference to lookahead token.  */
  yyn = yypact[yystate];
  if (yypact_value_is_default (yyn))
    goto yydefault;

  /* Not known => get a lookahead token if don't already have one.  */

  /* YYCHAR is either empty, or end-of-input, or a valid lookahead.  */
  if (yychar == AMREX_PARSEREMPTY)
    {
      YYDPRINTF ((stderr, "Reading a token\n"));
      yychar = yylex ();
    }

  if (yychar <= AMREX_PARSEREOF)
    {
      yychar = AMREX_PARSEREOF;
      yytoken = YYSYMBOL_YYEOF;
      YYDPRINTF ((stderr, "Now at end of input.\n"));
    }
  else if (yychar == AMREX_PARSERerror)
    {
      /* The scanner already issued an error message, process directly
         to error recovery.  But do not keep the error token as
         lookahead, it is too special and may lead us to an endless
         loop in error recovery. */
      yychar = AMREX_PARSERUNDEF;
      yytoken = YYSYMBOL_YYerror;
      goto yyerrlab1;
    }
  else
    {
      yytoken = YYTRANSLATE (yychar);
      YY_SYMBOL_PRINT ("Next token is", yytoken, &yylval, &yylloc);
    }

  /* If the proper action on seeing token YYTOKEN is to reduce or to
     detect an error, take that action.  */
  yyn += yytoken;
  if (yyn < 0 || YYLAST < yyn || yycheck[yyn] != yytoken)
    goto yydefault;
  yyn = yytable[yyn];
  if (yyn <= 0)
    {
      if (yytable_value_is_error (yyn))
        goto yyerrlab;
      yyn = -yyn;
      goto yyreduce;
    }

  /* Count tokens shifted since error; after three, turn off error
     status.  */
  if (yyerrstatus)
    yyerrstatus--;

  /* Shift the lookahead token.  */
  YY_SYMBOL_PRINT ("Shifting", yytoken, &yylval, &yylloc);
  yystate = yyn;
  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END

  /* Discard the shifted token.  */
  yychar = AMREX_PARSEREMPTY;
  goto yynewstate;


/*-----------------------------------------------------------.
| yydefault -- do the default action for the current state.  |
`-----------------------------------------------------------*/
yydefault:
  yyn = yydefact[yystate];
  if (yyn == 0)
    goto yyerrlab;
  goto yyreduce;


/*-----------------------------.
| yyreduce -- do a reduction.  |
`-----------------------------*/
yyreduce:
  /* yyn is the number of a rule to reduce with.  */
  yylen = yyr2[yyn];

  /* If YYLEN is nonzero, implement the default value of the action:
     '$$ = $1'.

     Otherwise, the following line sets YYVAL to garbage.
     This behavior is undocumented and Bison
     users should not rely upon it.  Assigning to YYVAL
     unconditionally makes the parser a bit smaller, and it avoids a
     GCC warning that YYVAL may be used uninitialized.  */
  yyval = yyvsp[1-yylen];


  YY_REDUCE_PRINT (yyn);
  switch (yyn)
    {
  case 3: /* input: input exp EOL  */
                {
    amrex::parser_defexpr((yyvsp[-1].n));
  }
    break;

  case 4: /* exp: NUMBER  */
                             { (yyval.n) = amrex::parser_newnumber((yyvsp[0].d)); }
    break;

  case 5: /* exp: SYMBOL  */
                             { (yyval.n) = amrex::parser_newsymbol((yyvsp[0].s)); }
    break;

  case 6: /* exp: exp '+' exp  */
                             { (yyval.n) = amrex::parser_newnode(amrex::PARSER_ADD, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 7: /* exp: exp '-' exp  */
                             { (yyval.n) = amrex::parser_newnode(amrex::PARSER_SUB, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 8: /* exp: exp '*' exp  */
                             { (yyval.n) = amrex::parser_newnode(amrex::PARSER_MUL, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 9: /* exp: exp '/' exp  */
                             { (yyval.n) = amrex::parser_newnode(amrex::PARSER_DIV, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 10: /* exp: '(' exp ')'  */
                             { (yyval.n) = (yyvsp[-1].n); }
    break;

  case 11: /* exp: exp '<' exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_LT, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 12: /* exp: exp '>' exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_GT, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 13: /* exp: exp "<=" exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_LEQ, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 14: /* exp: exp ">=" exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_GEQ, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 15: /* exp: exp "==" exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_EQ, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 16: /* exp: exp "!=" exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_NEQ, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 17: /* exp: exp "and" exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_AND, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 18: /* exp: exp "or" exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_OR, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 19: /* exp: '-' exp  */
                             { (yyval.n) = amrex::parser_newnode(amrex::PARSER_NEG, (yyvsp[0].n), nullptr); }
    break;

  case 20: /* exp: '+' exp  */
                             { (yyval.n) = (yyvsp[0].n); }
    break;

  case 21: /* exp: exp "**" exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_POW, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 22: /* exp: F1 '(' exp ')'  */
                             { (yyval.n) = amrex::parser_newf1((yyvsp[-3].f1), (yyvsp[-1].n)); }
    break;

  case 23: /* exp: F2 '(' exp ',' exp ')'  */
                             { (yyval.n) = amrex::parser_newf2((yyvsp[-5].f2), (yyvsp[-3].n), (yyvsp[-1].n)); }
    break;

  case 24: /* exp: F3 '(' exp ',' exp ',' exp ')'  */
                                 { (yyval.n) = amrex::parser_newf3((yyvsp[-7].f3), (yyvsp[-5].n), (yyvsp[-3].n), (yyvsp[-1].n)); }
    break;

  case 25: /* exp: SYMBOL '=' exp  */
                             { (yyval.n) = amrex::parser_newassign((yyvsp[-2].s), (yyvsp[0].n)); }
    break;

  case 26: /* exp: exp ';' exp  */
                             { (yyval.n) = amrex::parser_newlist((yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 27: /* exp: exp ';'  */
                             { (yyval.n) = amrex::parser_newlist((yyvsp[-1].n), nullptr); }
    break;



      default: break;
    }
  /* User semantic actions sometimes alter yychar, and that requires
     that yytoken be updated with the new translation.  We take the
     approach of translating immediately before every use of yytoken.
     One alternative is translating here after every semantic action,
     but that translation would be missed if the semantic action invokes
     YYABORT, YYACCEPT, or YYERROR immediately after altering yychar or
     if it invokes YYBACKUP.  In the case of YYABORT or YYACCEPT, an
     incorrect destructor might then be invoked immediately.  In the
     case of YYERROR or YYBACKUP, subsequent parser actions might lead
     to an incorrect destructor call or verbose syntax error message
     before the lookahead is translated.  */
  YY_SYMBOL_PRINT ("-> $$ =", YY_CAST (yysymbol_kind_t, yyr1[yyn]), &yyval, &yyloc);

  YYPOPSTACK (yylen);
  yylen = 0;

  *++yyvsp = yyval;

  /* Now 'shift' the result of the reduction.  Determine what state
     that goes to, based on the state we popped back to and the rule
     number reduced by.  */
  {
    const int yylhs = yyr1[yyn] - YYNTOKENS;
    const int yyi = yypgoto[yylhs] + *yyssp;
    yystate = (0 <= yyi && yyi <= YYLAST && yycheck[yyi] == *yyssp
               ? yytable[yyi]
               : yydefgoto[yylhs]);
  }

  goto yynewstate;


/*--------------------------------------.
| yyerrlab -- here on detecting error.  |
`--------------------------------------*/
yyerrlab:
  /* Make sure we have latest lookahead translation.  See comments at
     user semantic actions for why this is necessary.  */
  yytoken = yychar == AMREX_PARSEREMPTY ? YYSYMBOL_YYEMPTY : YYTRANSLATE (yychar);
  /* If not already recovering from an error, report this error.  */
  if (!yyerrstatus)
    {
      ++yynerrs;
      yyerror (YY_("syntax error"));
    }

  if (yyerrstatus == 3)
    {
      /* If just tried and failed to reuse lookahead token after an
         error, discard it.  */

      if (yychar <= AMREX_PARSEREOF)
        {
          /* Return failure if at end of input.  */
          if (yychar == AMREX_PARSEREOF)
            YYABORT;
        }
      else
        {
          yydestruct ("Error: discarding",
                      yytoken, &yylval);
          yychar = AMREX_PARSEREMPTY;
        }
    }

  /* Else will try to reuse lookahead token after shifting the error
     token.  */
  goto yyerrlab1;


/*---------------------------------------------------.
| yyerrorlab -- error raised explicitly by YYERROR.  |
`---------------------------------------------------*/
yyerrorlab:
  /* Pacify compilers when the user code never invokes YYERROR and the
     label yyerrorlab therefore never appears in user code.  */
  if (0)
    YYERROR;

  /* Do not reclaim the symbols of the rule whose action triggered
     this YYERROR.  */
  YYPOPSTACK (yylen);
  yylen = 0;
  YY_STACK_PRINT (yyss, yyssp);
  yystate = *yyssp;
  goto yyerrlab1;


/*-------------------------------------------------------------.
| yyerrlab1 -- common code for both syntax error and YYERROR.  |
`-------------------------------------------------------------*/
yyerrlab1:
  yyerrstatus = 3;      /* Each real token shifted decrements this.  */

  /* Pop stack until we find a state that shifts the error token.  */
  for (;;)
    {
      yyn = yypact[yystate];
      if (!yypact_value_is_default (yyn))
        {
          yyn += YYSYMBOL_YYerror;
          if (0 <= yyn && yyn <= YYLAST && yycheck[yyn] == YYSYMBOL_YYerror)
            {
              yyn = yytable[yyn];
              if (0 < yyn)
                break;
            }
        }

      /* Pop the current state because it cannot handle the error token.  */
      if (yyssp == yyss)
        YYABORT;


      yydestruct ("Error: popping",
                  YY_ACCESSING_SYMBOL (yystate), yyvsp);
      YYPOPSTACK (1);
      yystate = *yyssp;
      YY_STACK_PRINT (yyss, yyssp);
    }

  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END


  /* Shift the error token.  */
  YY_SYMBOL_PRINT ("Shifting", YY_ACCESSING_SYMBOL (yyn), yyvsp, yylsp);

  yystate = yyn;
  goto yynewstate;


/*-------------------------------------.
| yyacceptlab -- YYACCEPT comes here.  |
`-------------------------------------*/
yyacceptlab:
  yyresult = 0;
  goto yyreturn;


/*-----------------------------------.
| yyabortlab -- YYABORT comes here.  |
`-----------------------------------*/
yyabortlab:
  yyresult = 1;
  goto yyreturn;


#if !defined yyoverflow
/*-------------------------------------------------.
| yyexhaustedlab -- memory exhaustion comes here.  |
`-------------------------------------------------*/
yyexhaustedlab:
  yyerror (YY_("memory exhausted"));
  yyresult = 2;
  goto yyreturn;
#endif


/*-------------------------------------------------------.
| yyreturn -- parsing is finished, clean up and return.  |
`-------------------------------------------------------*/
yyreturn:
  if (yychar != AMREX_PARSEREMPTY)
    {
      /* Make sure we have latest lookahead translation.  See comments at
         user semantic actions for why this is necessary.  */
      yytoken = YYTRANSLATE (yychar);
      yydestruct ("Cleanup: discarding lookahead",
                  yytoken, &yylval);
    }
  /* Do not reclaim the symbols of the rule whose action triggered
     this YYABORT or YYACCEPT.  */
  YYPOPSTACK (yylen);
  YY_STACK_PRINT (yyss, yyssp);
  while (yyssp != yyss)
    {
      yydestruct ("Cleanup: popping",
                  YY_ACCESSING_SYMBOL (+*yyssp), yyvsp);
      YYPOPSTACK (1);
    }
#ifndef yyoverflow
  if (yyss != yyssa)
    YYSTACK_FREE (yyss);
#endif

  return yyresult;
}